

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_function.hpp
# Opt level: O3

scalar_function_t *
duckdb::ScalarFunction::GetScalarUnaryFunction<duckdb::NegateOperator>
          (scalar_function_t *__return_storage_ptr__,LogicalType *type)

{
  LogicalTypeId LVar1;
  InternalException *this;
  undefined1 local_48 [32];
  
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  LVar1 = type->id_;
  switch(LVar1) {
  case TINYINT:
    local_48._0_8_ = UnaryFunction<signed_char,signed_char,duckdb::NegateOperator>;
    break;
  case SMALLINT:
    local_48._0_8_ = UnaryFunction<short,short,duckdb::NegateOperator>;
    break;
  case INTEGER:
    local_48._0_8_ = UnaryFunction<int,int,duckdb::NegateOperator>;
    break;
  case BIGINT:
    local_48._0_8_ = UnaryFunction<long,long,duckdb::NegateOperator>;
    break;
  case DATE:
  case TIME:
  case TIMESTAMP_SEC:
  case TIMESTAMP_MS:
  case TIMESTAMP:
  case TIMESTAMP_NS:
  case DECIMAL:
  case CHAR:
  case VARCHAR:
  case BLOB:
  case INTERVAL:
switchD_00948770_caseD_f:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_48._0_8_ = local_48 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"Unimplemented type for GetScalarUnaryFunction","");
    InternalException::InternalException(this,(string *)local_48);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    local_48._0_8_ = UnaryFunction<float,float,duckdb::NegateOperator>;
    break;
  case DOUBLE:
    local_48._0_8_ = UnaryFunction<double,double,duckdb::NegateOperator>;
    break;
  case UTINYINT:
    local_48._0_8_ = UnaryFunction<unsigned_char,unsigned_char,duckdb::NegateOperator>;
    break;
  case USMALLINT:
    local_48._0_8_ = UnaryFunction<unsigned_short,unsigned_short,duckdb::NegateOperator>;
    break;
  case UINTEGER:
    local_48._0_8_ = UnaryFunction<unsigned_int,unsigned_int,duckdb::NegateOperator>;
    break;
  case UBIGINT:
    local_48._0_8_ = UnaryFunction<unsigned_long,unsigned_long,duckdb::NegateOperator>;
    break;
  default:
    if (LVar1 == UHUGEINT) {
      local_48._0_8_ = UnaryFunction<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::NegateOperator>;
    }
    else {
      if (LVar1 != HUGEINT) goto switchD_00948770_caseD_f;
      local_48._0_8_ = UnaryFunction<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::NegateOperator>;
    }
  }
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
            ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
             __return_storage_ptr__,
             (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)local_48);
  return __return_storage_ptr__;
}

Assistant:

static scalar_function_t GetScalarUnaryFunction(const LogicalType &type) {
		scalar_function_t function;
		switch (type.id()) {
		case LogicalTypeId::TINYINT:
			function = &ScalarFunction::UnaryFunction<int8_t, int8_t, OP>;
			break;
		case LogicalTypeId::SMALLINT:
			function = &ScalarFunction::UnaryFunction<int16_t, int16_t, OP>;
			break;
		case LogicalTypeId::INTEGER:
			function = &ScalarFunction::UnaryFunction<int32_t, int32_t, OP>;
			break;
		case LogicalTypeId::BIGINT:
			function = &ScalarFunction::UnaryFunction<int64_t, int64_t, OP>;
			break;
		case LogicalTypeId::UTINYINT:
			function = &ScalarFunction::UnaryFunction<uint8_t, uint8_t, OP>;
			break;
		case LogicalTypeId::USMALLINT:
			function = &ScalarFunction::UnaryFunction<uint16_t, uint16_t, OP>;
			break;
		case LogicalTypeId::UINTEGER:
			function = &ScalarFunction::UnaryFunction<uint32_t, uint32_t, OP>;
			break;
		case LogicalTypeId::UBIGINT:
			function = &ScalarFunction::UnaryFunction<uint64_t, uint64_t, OP>;
			break;
		case LogicalTypeId::HUGEINT:
			function = &ScalarFunction::UnaryFunction<hugeint_t, hugeint_t, OP>;
			break;
		case LogicalTypeId::UHUGEINT:
			function = &ScalarFunction::UnaryFunction<uhugeint_t, uhugeint_t, OP>;
			break;
		case LogicalTypeId::FLOAT:
			function = &ScalarFunction::UnaryFunction<float, float, OP>;
			break;
		case LogicalTypeId::DOUBLE:
			function = &ScalarFunction::UnaryFunction<double, double, OP>;
			break;
		default:
			throw InternalException("Unimplemented type for GetScalarUnaryFunction");
		}
		return function;
	}